

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraphPath.cc
# Opt level: O0

ostream * operator<<(ostream *os,SequenceDistanceGraphPath *sdgp)

{
  ostream *poVar1;
  size_type sVar2;
  vector<long,_std::allocator<long>_> *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"SequenceDistanceGraphPath (");
  poVar1 = std::operator<<(poVar1,(string *)
                                  (in_RSI[1].super__Vector_base<long,_std::allocator<long>_>._M_impl
                                   .super__Vector_impl_data._M_start + 4));
  poVar1 = std::operator<<(poVar1,"): ");
  sVar2 = std::vector<long,_std::allocator<long>_>::size(in_RSI);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  std::operator<<(poVar1," nodes");
  return in_RDI;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const SequenceDistanceGraphPath &sdgp) {
    os << "SequenceDistanceGraphPath (" << sdgp.sg.name << "): " << sdgp.nodes.size() << " nodes";
    return os;
}